

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_avx2.c
# Opt level: O1

void av1_quantize_fp_64x64_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan_ptr,
               int16_t *iscan_ptr)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  
  auVar9._8_2_ = 2;
  auVar9._0_8_ = 0x2000200020002;
  auVar9._10_2_ = 2;
  auVar9._12_2_ = 2;
  auVar9._14_2_ = 2;
  auVar9 = vpaddw_avx(auVar9,*(undefined1 (*) [16])round_ptr);
  auVar9 = vpsraw_avx(auVar9,2);
  auVar4 = vpermq_avx2(ZEXT1632(auVar9),0x54);
  auVar5 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])quant_ptr),0x54);
  auVar6 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])dequant_ptr),0x54);
  auVar12 = vpsraw_avx2(auVar6,3);
  auVar3 = vpcmpeqd_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
  auVar15 = vpackssdw_avx2(*(undefined1 (*) [32])coeff_ptr,*(undefined1 (*) [32])(coeff_ptr + 8));
  auVar13 = vpabsw_avx2(auVar15);
  auVar14 = vpcmpgtw_avx2(auVar12,auVar13);
  if (((uint)(SUB321(auVar14 >> 7,0) & 1) | (uint)(SUB321(auVar14 >> 0xf,0) & 1) << 1 |
       (uint)(SUB321(auVar14 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar14 >> 0x1f,0) & 1) << 3 |
       (uint)(SUB321(auVar14 >> 0x27,0) & 1) << 4 | (uint)(SUB321(auVar14 >> 0x2f,0) & 1) << 5 |
       (uint)(SUB321(auVar14 >> 0x37,0) & 1) << 6 | (uint)(SUB321(auVar14 >> 0x3f,0) & 1) << 7 |
       (uint)(SUB321(auVar14 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar14 >> 0x4f,0) & 1) << 9 |
       (uint)(SUB321(auVar14 >> 0x57,0) & 1) << 10 | (uint)(SUB321(auVar14 >> 0x5f,0) & 1) << 0xb |
       (uint)(SUB321(auVar14 >> 0x67,0) & 1) << 0xc | (uint)(SUB321(auVar14 >> 0x6f,0) & 1) << 0xd |
       (uint)(SUB321(auVar14 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar14 >> 0x7f,0) << 0xf |
       (uint)(SUB321(auVar14 >> 0x87,0) & 1) << 0x10 | (uint)(SUB321(auVar14 >> 0x8f,0) & 1) << 0x11
       | (uint)(SUB321(auVar14 >> 0x97,0) & 1) << 0x12 |
       (uint)(SUB321(auVar14 >> 0x9f,0) & 1) << 0x13 | (uint)(SUB321(auVar14 >> 0xa7,0) & 1) << 0x14
       | (uint)(SUB321(auVar14 >> 0xaf,0) & 1) << 0x15 |
       (uint)(SUB321(auVar14 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar14 >> 0xbf,0) << 0x17 |
       (uint)(SUB321(auVar14 >> 199,0) & 1) << 0x18 | (uint)(SUB321(auVar14 >> 0xcf,0) & 1) << 0x19
       | (uint)(SUB321(auVar14 >> 0xd7,0) & 1) << 0x1a |
       (uint)(SUB321(auVar14 >> 0xdf,0) & 1) << 0x1b | (uint)(SUB321(auVar14 >> 0xe7,0) & 1) << 0x1c
       | (uint)(SUB321(auVar14 >> 0xef,0) & 1) << 0x1d |
       (uint)(SUB321(auVar14 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar14[0x1f] >> 7) << 0x1f) ==
      0xffffffff) {
    auVar10 = ZEXT1664((undefined1  [16])0x0);
    auVar15 = auVar10._0_32_;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar15;
    *(undefined1 (*) [32])qcoeff_ptr = auVar15;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar15;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar15;
  }
  else {
    auVar13 = vpaddsw_avx2(auVar13,auVar4);
    auVar13 = vpandn_avx2(auVar14,auVar13);
    auVar14 = vpmulhw_avx2(auVar13,auVar5);
    auVar13 = vpmullw_avx2(auVar13,auVar5);
    auVar13 = vpsrlw_avx2(auVar13,0xe);
    auVar14 = vpsllw_avx2(auVar14,2);
    auVar16 = vpor_avx2(auVar14,auVar13);
    auVar13 = vpmulhw_avx2(auVar16,auVar6);
    auVar14 = vpmullw_avx2(auVar16,auVar6);
    auVar14 = vpsrlw_avx2(auVar14,2);
    auVar13 = vpsllw_avx2(auVar13,0xe);
    auVar13 = vpor_avx2(auVar13,auVar14);
    auVar16 = vpsignw_avx2(auVar16,auVar15);
    auVar15 = vpsignw_avx2(auVar13,auVar15);
    auVar14 = vpcmpeqw_avx2(auVar15,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar13 = vpsraw_avx2(auVar16,0xf);
    auVar17 = vpunpcklwd_avx2(auVar16,auVar13);
    auVar13 = vpunpckhwd_avx2(auVar16,auVar13);
    *(undefined1 (*) [32])qcoeff_ptr = auVar17;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar13;
    auVar13 = vpsraw_avx2(auVar15,0xf);
    auVar16 = vpunpcklwd_avx2(auVar15,auVar13);
    auVar15 = vpunpckhwd_avx2(auVar15,auVar13);
    *(undefined1 (*) [32])dqcoeff_ptr = auVar16;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar15;
    auVar15 = vpermq_avx2(*(undefined1 (*) [32])iscan_ptr,0xd8);
    auVar15 = vpaddw_avx2(auVar14,auVar15);
    auVar15 = vpsubw_avx2(auVar15,auVar3);
    auVar15 = vpmaxsw_avx2(auVar15,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar15 = vpandn_avx2(auVar14,auVar15);
    auVar10 = ZEXT3264(auVar15);
  }
  auVar15 = auVar10._0_32_;
  if (0x10 < n_coeffs) {
    auVar15 = vpaddw_avx2(auVar12,auVar3);
    auVar3 = vpermq_avx2(auVar15,0xee);
    auVar14 = vpermq_avx2(auVar6,0xee);
    auVar5 = vpermq_avx2(auVar5,0xee);
    auVar4 = vpermq_avx2(auVar4,0xee);
    lVar7 = n_coeffs + 0x10;
    lVar8 = 0;
    auVar13 = vpcmpeqd_avx2(auVar13,auVar13);
    do {
      auVar6 = vpackssdw_avx2(*(undefined1 (*) [32])((long)coeff_ptr + lVar8 * 2 + 0x40),
                              *(undefined1 (*) [32])((long)coeff_ptr + lVar8 * 2 + 0x60));
      auVar15 = vpabsw_avx2(auVar6);
      auVar12 = vpcmpgtw_avx2(auVar15,auVar3);
      auVar16 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if ((((((((((((((((((((((((((((((((auVar12 >> 7 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar12 >> 0xf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar12 >> 0x17 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar12 >> 0x1f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar12 >> 0x27 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar12 >> 0x2f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar12 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar12 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar12 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar12 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar12 >> 0x57 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar12 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar12 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar12 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar12 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar12 >> 0x7f,0) == '\0') &&
                        (auVar12 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar12 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar12 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar12 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar12 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar12 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar12 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar12 >> 0xbf,0) == '\0') &&
                (auVar12 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar12 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar12 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar12 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar12 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar12 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar12 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar12[0x1f])
      {
        pauVar1 = (undefined1 (*) [32])((long)dqcoeff_ptr + lVar8 * 2 + 0x40);
        pauVar2 = (undefined1 (*) [32])((long)qcoeff_ptr + lVar8 * 2 + 0x40);
        pauVar2[1] = auVar16;
        *pauVar2 = auVar16;
        pauVar1[1] = auVar16;
        *pauVar1 = auVar16;
      }
      else {
        auVar15 = vpaddsw_avx2(auVar15,auVar4);
        auVar15 = vpand_avx2(auVar12,auVar15);
        auVar12 = vpmulhw_avx2(auVar15,auVar5);
        auVar15 = vpmullw_avx2(auVar15,auVar5);
        auVar15 = vpsrlw_avx2(auVar15,0xe);
        auVar12 = vpsllw_avx2(auVar12,2);
        auVar17 = vpor_avx2(auVar12,auVar15);
        auVar15 = vpmulhw_avx2(auVar17,auVar14);
        auVar12 = vpmullw_avx2(auVar17,auVar14);
        auVar12 = vpsrlw_avx2(auVar12,2);
        auVar15 = vpsllw_avx2(auVar15,0xe);
        auVar15 = vpor_avx2(auVar15,auVar12);
        auVar12 = vpsignw_avx2(auVar17,auVar6);
        auVar15 = vpsignw_avx2(auVar15,auVar6);
        auVar6 = vpcmpeqw_avx2(auVar15,auVar16);
        auVar17 = vpsraw_avx2(auVar12,0xf);
        auVar16 = vpunpcklwd_avx2(auVar12,auVar17);
        auVar12 = vpunpckhwd_avx2(auVar12,auVar17);
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar8 * 2 + 0x40) = auVar16;
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar8 * 2 + 0x60) = auVar12;
        auVar16 = vpsraw_avx2(auVar15,0xf);
        auVar12 = vpunpcklwd_avx2(auVar15,auVar16);
        auVar15 = vpunpckhwd_avx2(auVar15,auVar16);
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar8 * 2 + 0x40) = auVar12;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar8 * 2 + 0x60) = auVar15;
        auVar15 = vpermq_avx2(*(undefined1 (*) [32])((long)iscan_ptr + lVar8 + 0x20),0xd8);
        auVar15 = vpaddw_avx2(auVar6,auVar15);
        auVar15 = vpsubw_avx2(auVar15,auVar13);
        auVar15 = vpandn_avx2(auVar6,auVar15);
        auVar15 = vpmaxsw_avx2(auVar10._0_32_,auVar15);
        auVar10 = ZEXT3264(auVar15);
      }
      auVar15 = auVar10._0_32_;
      lVar8 = lVar8 + 0x20;
      lVar7 = lVar7 + -0x10;
    } while (0x20 < lVar7);
  }
  auVar9 = vpmaxsw_avx(auVar15._0_16_,auVar15._16_16_);
  auVar11._8_2_ = 0x7fff;
  auVar11._0_8_ = 0x7fff7fff7fff7fff;
  auVar11._10_2_ = 0x7fff;
  auVar11._12_2_ = 0x7fff;
  auVar11._14_2_ = 0x7fff;
  auVar9 = vpsubusw_avx(auVar11,auVar9);
  auVar9 = vphminposuw_avx(auVar9);
  *eob_ptr = auVar9._0_2_ ^ 0x7fff;
  return;
}

Assistant:

void av1_quantize_fp_64x64_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan_ptr, const int16_t *iscan_ptr) {
  (void)scan_ptr;
  (void)zbin_ptr;
  (void)quant_shift_ptr;

  const int log_scale = 2;
  const unsigned int step = 16;
  __m256i qp[3], thr;
  __m256i eob = _mm256_setzero_si256();

  init_qp(round_ptr, quant_ptr, dequant_ptr, log_scale, &thr, qp);

  quantize_fp_64x64(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr,
                    &eob);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan_ptr += step;
  n_coeffs -= step;

  update_qp(&thr, qp);

  while (n_coeffs > 0) {
    quantize_fp_64x64(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr,
                      &eob);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan_ptr += step;
    n_coeffs -= step;
  }
  *eob_ptr = quant_gather_eob(eob);
}